

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O0

void point_add_mixed(pt_prj_t_conflict4 *R,pt_prj_t_conflict4 *Q,pt_aff_t_conflict4 *P)

{
  uint64_t *in_RDX;
  uint64_t *in_RSI;
  uint64_t *in_RDI;
  limb_t *Z3;
  limb_t *T3;
  limb_t *Y3;
  limb_t *X3;
  limb_t *T2;
  limb_t *Y2;
  limb_t *X2;
  limb_t *Z1;
  limb_t *T1;
  limb_t *Y1;
  limb_t *X1;
  limb_t *d;
  fe_t_conflict1 t3;
  fe_t_conflict1 t2;
  fe_t_conflict1 t1;
  fe_t_conflict1 t0;
  uint64_t *in_stack_00000a30;
  uint64_t *in_stack_00000a38;
  uint64_t *in_stack_00000a40;
  uint64_t *arg1;
  uint64_t local_158 [10];
  uint64_t local_108 [10];
  uint64_t local_b8 [10];
  uint64_t local_68 [13];
  
  arg1 = in_RDX + 10;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000a40,in_stack_00000a38,in_stack_00000a30);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000a40,in_stack_00000a38,in_stack_00000a30);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000a40,in_stack_00000a38,in_stack_00000a30);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000a40,in_stack_00000a38,in_stack_00000a30);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_add(in_RDI,in_RSI,in_RSI + 10);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(in_RDX,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_add(in_RDI + 10,in_RDX,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(in_RDX,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000a40,in_stack_00000a38,in_stack_00000a30);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(local_158,in_RDI + 0x14,local_68);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(in_RDX,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(in_RDI + 0x14,local_158,local_b8);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(in_RDX,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_add(local_158,in_RSI + 0x1e,local_108);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(in_RDX,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(in_RDI + 0x1e,in_RSI + 0x1e,local_108);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(in_RDX,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(local_b8,local_b8,local_68);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(in_RDX,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000a40,in_stack_00000a38,in_stack_00000a30);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000a40,in_stack_00000a38,in_stack_00000a30);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000a40,in_stack_00000a38,in_stack_00000a30);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000a40,in_stack_00000a38,in_stack_00000a30);
  return;
}

Assistant:

static void point_add_mixed(pt_prj_t *R, const pt_prj_t *Q, const pt_aff_t *P) {
    /* temporary variables */
    fe_t t0, t1, t2, t3;
    /* constants */
    const limb_t *d = const_d;
    /* set pointers for Edwards curve arith */
    const limb_t *X1 = Q->X;
    const limb_t *Y1 = Q->Y;
    const limb_t *T1 = Q->T;
    const limb_t *Z1 = Q->Z;
    const limb_t *X2 = P->X;
    const limb_t *Y2 = P->Y;
    const limb_t *T2 = P->T;
    limb_t *X3 = R->X;
    limb_t *Y3 = R->Y;
    limb_t *T3 = R->T;
    limb_t *Z3 = R->Z;

    /* the curve arith formula */
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t0, X1, X2);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t1, Y1, Y2);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t2, d, T2);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t2, T1, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_add(X3, X1, Y1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_add(Y3, X2, Y2);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(T3, X3, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_sub(t3, T3, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_sub(T3, t3, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_add(t3, Z1, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_sub(Z3, Z1, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_sub(t1, t1, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(X3, T3, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(Y3, t3, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(T3, T3, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(Z3, Z3, t3);
}